

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.cpp
# Opt level: O0

void __thiscall spvtools::val::BasicBlock::BasicBlock(BasicBlock *this,uint32_t label_id)

{
  uint32_t label_id_local;
  BasicBlock *this_local;
  
  this->id_ = label_id;
  this->immediate_dominator_ = (BasicBlock *)0x0;
  this->immediate_structural_dominator_ = (BasicBlock *)0x0;
  this->immediate_structural_post_dominator_ = (BasicBlock *)0x0;
  memset(&this->predecessors_,0,0x18);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            (&this->predecessors_);
  memset(&this->successors_,0,0x18);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            (&this->successors_);
  std::bitset<7UL>::bitset(&this->type_,0);
  this->reachable_ = false;
  this->structurally_reachable_ = false;
  this->label_ = (Instruction *)0x0;
  this->terminator_ = (Instruction *)0x0;
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            (&this->structural_predecessors_);
  std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::vector
            (&this->structural_successors_);
  return;
}

Assistant:

BasicBlock::BasicBlock(uint32_t label_id)
    : id_(label_id),
      immediate_dominator_(nullptr),
      immediate_structural_dominator_(nullptr),
      immediate_structural_post_dominator_(nullptr),
      predecessors_(),
      successors_(),
      type_(0),
      reachable_(false),
      structurally_reachable_(false),
      label_(nullptr),
      terminator_(nullptr) {}